

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

string * __thiscall
duckdb::StringStats::Min_abi_cxx11_
          (string *__return_storage_ptr__,StringStats *this,BaseStatistics *stats)

{
  GetStringMinMaxValue_abi_cxx11_(__return_storage_ptr__,(duckdb *)(this + 0x28),(data_t *)stats);
  return __return_storage_ptr__;
}

Assistant:

string StringStats::Min(const BaseStatistics &stats) {
	return GetStringMinMaxValue(StringStats::GetDataUnsafe(stats).min);
}